

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.cpp
# Opt level: O0

void __thiscall C_A_T_C_H_T_E_S_T_2::visitor::operator()(visitor *this,float a,int b)

{
  Decomposer local_191;
  int *local_190;
  BinaryExpr<const_int_&,_const_int_&> local_188;
  StringRef local_158;
  SourceLineInfo local_148;
  StringRef local_138;
  undefined1 local_128 [8];
  AssertionHandler catchAssertionHandler_1;
  Decomposer local_c9;
  float *local_c8;
  BinaryExpr<const_float_&,_const_float_&> local_c0;
  StringRef local_90;
  SourceLineInfo local_80;
  StringRef local_70;
  undefined1 local_60 [8];
  AssertionHandler catchAssertionHandler;
  int b_local;
  float a_local;
  visitor *this_local;
  
  catchAssertionHandler.m_resultCapture._0_4_ = b;
  catchAssertionHandler.m_resultCapture._4_4_ = a;
  local_70 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_80,
             "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/visitor.cpp"
             ,0xaa);
  Catch::StringRef::StringRef(&local_90,"a == 3.14f");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_60,&local_70,&local_80,local_90,Normal);
  local_c8 = (float *)Catch::Decomposer::operator<=
                                (&local_c9,
                                 (float *)((long)&catchAssertionHandler.m_resultCapture + 4));
  catchAssertionHandler_1.m_resultCapture._0_4_ = 0x4048f5c3;
  Catch::ExprLhs<float_const&>::operator==
            (&local_c0,(ExprLhs<float_const&> *)&local_c8,
             (float *)&catchAssertionHandler_1.m_resultCapture);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_60,&local_c0.super_ITransientExpression);
  Catch::BinaryExpr<const_float_&,_const_float_&>::~BinaryExpr(&local_c0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_60);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_60);
  local_138 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_148,
             "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/visitor.cpp"
             ,0xab);
  Catch::StringRef::StringRef(&local_158,"b == value");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_128,&local_138,&local_148,local_158,Normal);
  local_190 = (int *)Catch::Decomposer::operator<=
                               (&local_191,(int *)&catchAssertionHandler.m_resultCapture);
  Catch::ExprLhs<int_const&>::operator==(&local_188,(ExprLhs<int_const&> *)&local_190,&this->value);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_128,&local_188.super_ITransientExpression);
  Catch::BinaryExpr<const_int_&,_const_int_&>::~BinaryExpr(&local_188);
  Catch::AssertionHandler::complete((AssertionHandler *)local_128);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_128);
  return;
}

Assistant:

void operator()(float a, int b)
            {
                REQUIRE(a == 3.14f);
                REQUIRE(b == value);
            }